

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

Node * CleanNode(TidyDocImpl *doc,Node *node)

{
  TidyTriState state;
  TidyTriState state_00;
  Node *node_00;
  Node *pNVar1;
  Bool BVar2;
  uint uVar3;
  uint uVar4;
  AttVal *pAVar5;
  AttVal *pAVar6;
  Dict *pDVar7;
  tmbstr ptVar8;
  TidyTagId TVar9;
  ctmbstr property;
  Node **in_R8;
  long lVar10;
  Node *pNVar11;
  AttVal *pAVar12;
  ctmbstr local_140;
  ctmbstr local_138;
  char acStack_12c [252];
  
  state = *(TidyTriState *)((doc->config).value + 0x32);
  state_00 = *(TidyTriState *)((doc->config).value + 0x34);
LAB_0014d023:
  while( true ) {
    BVar2 = prvTidynodeIsElement(node);
    if (BVar2 == no) {
      return node;
    }
    if ((node == (Node *)0x0) || (pDVar7 = node->tag, pDVar7 == (Dict *)0x0)) goto LAB_0014d0b4;
    TVar9 = pDVar7->id;
    if ((TVar9 == TidyTag_DIR) || ((TVar9 == TidyTag_UL || (TVar9 == TidyTag_OL)))) break;
LAB_0014d068:
    if ((((TVar9 == TidyTag_UL) || (TVar9 == TidyTag_OL)) &&
        ((pNVar11 = node->content, pNVar11 != (Node *)0x0 &&
         ((pNVar11->next == (Node *)0x0 && (node_00 = pNVar11->content, node_00 != (Node *)0x0))))))
       && ((node_00->tag == pDVar7 && (node_00->next == (Node *)0x0)))) {
      node_00->next = node->next;
      pNVar1 = node->prev;
      node_00->parent = node->parent;
      node_00->prev = pNVar1;
      prvTidyFixNodeLinks(node_00);
      pNVar11->content = (Node *)0x0;
      prvTidyFreeNode(doc,pNVar11);
      node->next = (Node *)0x0;
      node->content = (Node *)0x0;
      prvTidyFreeNode(doc,node);
      pNVar11 = node_00->prev;
      if (pNVar11 == (Node *)0x0) {
        return node_00;
      }
      if (pNVar11->tag == (Dict *)0x0) {
        return node_00;
      }
      TVar9 = pNVar11->tag->id;
      if ((TVar9 != TidyTag_UL) && (TVar9 != TidyTag_OL)) {
        return node_00;
      }
      pNVar1 = pNVar11->last;
      if (pNVar1 == (Node *)0x0) {
        return node_00;
      }
      pNVar11->next = node_00->next;
      prvTidyFixNodeLinks(pNVar11);
      node_00->parent = pNVar1;
      node_00->next = (Node *)0x0;
      node_00->prev = pNVar1->last;
      prvTidyFixNodeLinks(node_00);
      CleanNode(doc,node_00);
      return node_00;
    }
    if (pDVar7->id != TidyTag_CENTER) goto LAB_0014d0b4;
    RenameElem(doc,node,TidyTag_DIV);
    prvTidyAddStyleProperty(doc,node,"text-align: center");
  }
  pNVar11 = node->content;
  if ((pNVar11 == (Node *)0x0) ||
     ((((pNVar11->next != (Node *)0x0 || (pNVar11->tag == (Dict *)0x0)) ||
       (pNVar11->tag->id != TidyTag_LI)) || (pNVar11->implicit == no)))) {
    TVar9 = pDVar7->id;
    goto LAB_0014d068;
  }
  pDVar7 = prvTidyLookupTagDef(TidyTag_DIV);
  node->tag = pDVar7;
  (*doc->allocator->vtbl->free)(doc->allocator,node->element);
  ptVar8 = prvTidytmbstrdup(doc->allocator,"div");
  node->element = ptVar8;
  property = "margin-left: 2em";
  goto LAB_0014d38f;
LAB_0014d0b4:
  BVar2 = MergeNestedElements(doc,TidyTag_DIV,state,node,in_R8);
  if ((BVar2 != no) ||
     (BVar2 = MergeNestedElements(doc,TidyTag_SPAN,state_00,node,in_R8), BVar2 != no))
  goto LAB_0014d023;
  if ((node != (Node *)0x0) &&
     ((((node->tag != (Dict *)0x0 && (uVar3 = node->tag->id - TidyTag_TABLE, uVar3 < 9)) &&
       ((0x125U >> (uVar3 & 0x1f) & 1) != 0)) &&
      (pAVar5 = prvTidyAttrGetById(node,TidyAttr_BGCOLOR), pAVar5 != (AttVal *)0x0)))) {
    prvTidytmbsnprintf((tmbstr)&local_138,0x100,"background-color: %s");
    prvTidyRemoveAttribute(doc,node,pAVar5);
    prvTidyAddStyleProperty(doc,node,(ctmbstr)&local_138);
  }
  BVar2 = CanApplyBlockStyle(node);
  if (BVar2 == no) {
LAB_0014d2d0:
    BVar2 = CanApplyInlineStyle(node);
    if ((BVar2 == no) ||
       ((pNVar11 = node->content, pNVar11 == (Node *)0x0 || (pNVar11->next != (Node *)0x0)))) {
LAB_0014d2ec:
      if ((((node->parent->content == node) && (node->next == (Node *)0x0)) &&
          ((BVar2 = CanApplyBlockStyle(node->parent), BVar2 != no ||
           (BVar2 = CanApplyInlineStyle(node->parent), BVar2 != no)))) ||
         (BVar2 = FindCSSSpanEq(node,&local_138,yes), BVar2 == no)) {
        if (node->tag == (Dict *)0x0) {
          return node;
        }
        if (node->tag->id != TidyTag_FONT) {
          return node;
        }
        if (((node->parent->content == node) && (node->next == (Node *)0x0)) &&
           (BVar2 = CanApplyBlockStyle(node->parent), BVar2 != no)) {
          return node;
        }
        AddFontStyles(doc,node,node->attributes);
        pAVar5 = node->attributes;
        pAVar12 = (AttVal *)0x0;
        while (pAVar6 = pAVar5, pAVar6 != (AttVal *)0x0) {
          pAVar5 = pAVar6->next;
          if ((pAVar6->dict == (Attribute *)0x0) || (pAVar6->dict->id != TidyAttr_STYLE)) {
            prvTidyFreeAttribute(doc,pAVar6);
          }
          else {
            pAVar6->next = (AttVal *)0x0;
            pAVar12 = pAVar6;
          }
        }
        node->attributes = pAVar12;
        RenameElem(doc,node,TidyTag_SPAN);
      }
      else {
        RenameElem(doc,node,TidyTag_SPAN);
        prvTidyAddStyleProperty(doc,node,local_138);
      }
      goto LAB_0014d023;
    }
    BVar2 = FindCSSSpanEq(pNVar11,&local_138,no);
    if (BVar2 == no) {
      if ((pNVar11->tag == (Dict *)0x0) || (pNVar11->tag->id != TidyTag_FONT)) goto LAB_0014d2ec;
LAB_0014d3ec:
      MergeStyles(doc,node,pNVar11);
      AddFontStyles(doc,node,pNVar11->attributes);
      goto LAB_0014d394;
    }
    MergeStyles(doc,node,pNVar11);
    property = local_138;
  }
  else {
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_CAPTION))
    {
      pAVar12 = (AttVal *)0x0;
      pAVar5 = (AttVal *)&node->attributes;
      do {
        pAVar6 = pAVar12;
        pAVar5 = pAVar5->next;
        if (pAVar5 == (AttVal *)0x0) goto LAB_0014d2c0;
        pAVar12 = pAVar5;
      } while ((pAVar5->dict == (Attribute *)0x0) || (pAVar5->dict->id != TidyAttr_ALIGN));
      if (pAVar6 == (AttVal *)0x0) {
        pAVar6 = (AttVal *)&node->attributes;
      }
      pAVar6->next = pAVar5->next;
      ptVar8 = pAVar5->value;
      if (ptVar8 != (tmbstr)0x0) {
        prvTidytmbstrcpy((tmbstr)&local_138,"text-align: ");
        for (lVar10 = 0xc; lVar10 != 0x7f; lVar10 = lVar10 + 1) {
          uVar4 = prvTidyToLower((int)ptVar8[lVar10 + -0xc]);
          *(char *)((long)&local_138 + lVar10) = (char)uVar4;
          if ((char)uVar4 == '\0') break;
        }
        *(undefined1 *)((long)&local_138 + lVar10) = 0;
        prvTidyAddStyleProperty(doc,node,(ctmbstr)&local_138);
      }
      prvTidyFreeAttribute(doc,pAVar5);
    }
LAB_0014d2c0:
    pNVar11 = node->content;
    if ((pNVar11 == (Node *)0x0) || (pNVar11->next != (Node *)0x0)) goto LAB_0014d2d0;
    BVar2 = FindCSSSpanEq(pNVar11,&local_140,no);
    if (BVar2 == no) {
      if ((pNVar11->tag == (Dict *)0x0) || (pNVar11->tag->id != TidyTag_FONT)) goto LAB_0014d2d0;
      goto LAB_0014d3ec;
    }
    MergeStyles(doc,node,pNVar11);
    property = local_140;
  }
LAB_0014d38f:
  prvTidyAddStyleProperty(doc,node,property);
LAB_0014d394:
  StripOnlyChild(doc,node);
  goto LAB_0014d023;
}

Assistant:

Node* CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *next = NULL;
    TidyTriState mergeDivs = cfgAutoBool(doc, TidyMergeDivs);
    TidyTriState mergeSpans = cfgAutoBool(doc, TidyMergeSpans);

    for (next = node; TY_(nodeIsElement)(node); node = next)
    {
        if ( Dir2Div(doc, node, &next) )
            continue;

        /* Special case: true result means
        ** that arg node and its parent no longer exist.
        ** So we must jump back up the CreateStyleProperties()
        ** call stack until we have a valid node reference.
        */
        if ( NestedList(doc, node, &next) )
            return next;

        if ( Center2Div(doc, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_DIV, mergeDivs, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_SPAN, mergeSpans, node, &next) )
            continue;

        if ( BlockStyle(doc, node, &next) )
            continue;

        if ( InlineStyle(doc, node, &next) )
            continue;

        if ( InlineElementToCSS(doc, node, &next) )
            continue;

        if ( Font2Span(doc, node, &next) )
            continue;

        break;
    }

    return next;
}